

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.h
# Opt level: O0

cli_arguments_t * parse_arguments_abi_cxx11_(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  long in_RDX;
  int in_ESI;
  cli_arguments_t *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_char_*>_&&>::value,_pair<iterator,_bool>_>
  _Var4;
  string arg;
  int i;
  named_arguments_t named_arguments;
  positional_arguments_t positional_arguments;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  in_stack_fffffffffffffe30;
  string local_c8 [32];
  int local_a8;
  allocator local_91;
  string local_90 [36];
  int local_6c;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x19f8d8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)0x19f8e5);
  for (local_6c = 1; local_6c < local_c; local_6c = local_6c + 1) {
    pcVar2 = *(char **)(local_18 + (long)local_6c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar2,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
    if ((*pcVar2 == '-') &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_90), *pcVar2 == '-')) {
      std::__cxx11::string::substr((ulong)local_c8,(ulong)local_90);
      std::__cxx11::string::operator=(local_90,local_c8);
      std::__cxx11::string::~string(local_c8);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe20._M_cur,
                              (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
      ;
      if (bVar1) {
        std::make_pair<std::__cxx11::string&,char_const(&)[1]>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   (char (*) [1])in_stack_fffffffffffffe20._M_cur);
        std::
        unordered_map<std::__cxx11::string,char_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>
        ::insert<std::pair<std::__cxx11::string,char_const*>>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    *)in_stack_fffffffffffffe30._M_cur,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                    *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                 *)0x19fae5);
        local_a8 = 2;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe20._M_cur,
                                (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18
                                                ));
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe20._M_cur,
                                    (char *)CONCAT44(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18)), bVar1)) {
          std::make_pair<std::__cxx11::string&,char_const(&)[5]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                     (char (*) [5])in_stack_fffffffffffffe20._M_cur);
          _Var3 = std::
                  unordered_map<std::__cxx11::string,char_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>
                  ::insert<std::pair<std::__cxx11::string,char_const*>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                              *)in_stack_fffffffffffffe30._M_cur,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                              *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          in_stack_fffffffffffffe30._M_cur =
               (__node_type *)
               _Var3.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
               ._M_cur;
          in_stack_fffffffffffffe2f = _Var3.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   *)0x19fbc9);
          local_a8 = 4;
        }
        else {
          local_6c = local_6c + 1;
          std::make_pair<std::__cxx11::string&,char*&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                     (char **)in_stack_fffffffffffffe20._M_cur);
          _Var4 = std::
                  unordered_map<std::__cxx11::string,char_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>
                  ::insert<std::pair<std::__cxx11::string,char*>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                              *)in_stack_fffffffffffffe30._M_cur,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                              *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          in_stack_fffffffffffffe20._M_cur =
               (__node_type *)
               _Var4.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
               ._M_cur;
          in_stack_fffffffffffffe1c = CONCAT13(_Var4.second,(int3)in_stack_fffffffffffffe1c);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                   *)0x19fc78);
          local_a8 = 0;
        }
      }
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 in_stack_fffffffffffffe30._M_cur,
                 (value_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      local_a8 = 4;
    }
    std::__cxx11::string::~string(local_90);
    if ((local_a8 != 0) && (local_a8 == 2)) break;
    in_stack_fffffffffffffe18 = local_a8;
  }
  std::
  make_pair<std::vector<char_const*,std::allocator<char_const*>>&,std::unordered_map<std::__cxx11::string,char_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>>&>
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              *)in_stack_fffffffffffffe20._M_cur);
  local_a8 = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    *)0x19fd28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe30._M_cur
            );
  return in_RDI;
}

Assistant:

const cli_arguments_t parse_arguments(int argc, char** argv) {
	positional_arguments_t positional_arguments;
	named_arguments_t named_arguments;

	for (int i = 1; i < argc; ++i) {
		std::string arg(argv[i]);

		if (arg[0] != '-' || arg[1] != '-') {
			positional_arguments.push_back(argv[i]);
			continue;
		}

		// We have a named argument, check if we should have extra data attached to it
		arg = arg.substr(2);

		// For the help command, there is no additional data, and we can stop parsing
		if (arg == "help") {
			named_arguments.insert(std::make_pair(arg, ""));
			break;
		}

		// Also components and undirected has no data attached to it.
		// TODO: How to make this nicer without a lot of overhead
		if (arg == "components" || arg == "undirected") {
			named_arguments.insert(std::make_pair(arg, "true"));
			continue;
		}

		// We have extra data, so parse it
		named_arguments.insert(std::make_pair(arg, argv[++i]));
	}

	return std::make_pair(positional_arguments, named_arguments);
}